

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_2::DeepTiledInputFile::readTiles
          (DeepTiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  pointer ppTVar2;
  TileBuffer *pTVar3;
  InputStreamMutex *pIVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint64_t *puVar17;
  uint64_t uVar18;
  undefined4 extraout_var_00;
  char *pcVar19;
  Task *this_00;
  InputExc *pIVar20;
  ostream *poVar21;
  ArgExc *pAVar22;
  IoExc *this_01;
  long lVar23;
  long lVar24;
  string *psVar25;
  int dx;
  string *psVar26;
  ulong uVar27;
  bool bVar28;
  stringstream _iex_throw_s;
  TaskGroup taskGroup;
  stringstream local_340;
  byte bStack_33f;
  byte bStack_33e;
  byte bStack_33d;
  undefined4 uStack_33c;
  ostream local_330 [376];
  TaskGroup local_1b8 [392];
  undefined4 extraout_var;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar14 = pthread_mutex_lock(__mutex);
  if (iVar14 != 0) {
    std::__throw_system_error(iVar14);
  }
  pDVar1 = this->_data;
  if ((pDVar1->slices).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TInSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar1->slices).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TInSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar22,"No frame buffer specified as pixel data destination.");
    __cxa_throw(pAVar22,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  if ((((ly | lx) < 0) ||
      (((lx != ly && ((pDVar1->tileDesc).mode == MIPMAP_LEVELS)) || (pDVar1->numXLevels <= lx)))) ||
     (pDVar1->numYLevels <= ly)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(&local_340);
    std::__ostream_insert<char,std::char_traits<char>>(local_330,"Level coordinate (",0x12);
    poVar21 = (ostream *)std::ostream::operator<<((ostream *)local_330,lx);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
    poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,ly);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,") is invalid.",0xd);
    pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar22,&local_340);
    __cxa_throw(pAVar22,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  iVar14 = dx2;
  if (dx2 < dx1) {
    iVar14 = dx1;
  }
  if (dx1 < dx2) {
    dx2 = dx1;
  }
  uVar15 = dy2;
  if (dy1 < dy2) {
    uVar15 = dy1;
  }
  if (dy2 < dy1) {
    dy2 = dy1;
  }
  bVar28 = pDVar1->lineOrder != DECREASING_Y;
  uVar7 = uVar15 - 1;
  if (bVar28) {
    uVar7 = dy2 + 1;
    dy2 = uVar15;
  }
  IlmThread_3_2::TaskGroup::TaskGroup(local_1b8);
  if (dy2 != uVar7) {
    uVar27 = 0;
    do {
      uVar27 = (ulong)(int)uVar27;
      dx = dx2;
      do {
        bVar13 = isValidTile(this,dx,dy2,lx,ly);
        if (!bVar13) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(&local_340);
          std::__ostream_insert<char,std::char_traits<char>>(local_330,"Tile (",6);
          poVar21 = (ostream *)std::ostream::operator<<((ostream *)local_330,dx);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
          poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,dy2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
          poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,lx);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,",",1);
          poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,ly);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,") is not a valid tile.",0x16);
          pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(pAVar22,&local_340);
          __cxa_throw(pAVar22,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
        }
        pDVar1 = this->_data;
        ppTVar2 = (pDVar1->tileBuffers).
                  super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar3 = ppTVar2[uVar27 % (ulong)((long)(pDVar1->tileBuffers).
                                                super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)ppTVar2 >> 3)];
        IlmThread_3_2::Semaphore::wait();
        pTVar3->dx = dx;
        pTVar3->dy = dy2;
        pTVar3->lx = lx;
        pTVar3->ly = ly;
        pTVar3->uncompressedData = (char *)0x0;
        pIVar4 = pDVar1->_streamData;
        puVar17 = TileOffsets::operator()(&pDVar1->tileOffsets,dx,dy2,lx,ly);
        uVar5 = *puVar17;
        if (uVar5 == 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(&local_340);
          std::__ostream_insert<char,std::char_traits<char>>(local_330,"Tile (",6);
          poVar21 = (ostream *)std::ostream::operator<<((ostream *)local_330,dx);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
          poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,dy2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
          poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,lx);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
          poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,ly);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,") is missing.",0xd);
          pIVar20 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar20,&local_340);
          __cxa_throw(pIVar20,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
        }
        if ((pDVar1->version & 0x1000) == 0) {
          uVar18 = pIVar4->currentPosition;
        }
        else {
          iVar16 = (*pIVar4->is->_vptr_IStream[5])();
          uVar18 = CONCAT44(extraout_var,iVar16);
        }
        if (uVar18 != uVar5) {
          (*pIVar4->is->_vptr_IStream[6])(pIVar4->is,uVar5);
        }
        if ((pDVar1->version & 0x1000) != 0) {
          (*pIVar4->is->_vptr_IStream[3])(pIVar4->is,&local_340,4);
          iVar16 = CONCAT13(bStack_33d,CONCAT12(bStack_33e,CONCAT11(bStack_33f,local_340)));
          if (iVar16 != pDVar1->partNumber) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream(&local_340);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_330,"Unexpected part number ",0x17);
            poVar21 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,", should be ",0xc);
            poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,pDVar1->partNumber);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,".",1);
            pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::ArgExc::ArgExc(pAVar22,&local_340);
            __cxa_throw(pAVar22,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
          }
        }
        (*pIVar4->is->_vptr_IStream[3])(pIVar4->is,&local_340,4);
        iVar16 = CONCAT13(bStack_33d,CONCAT12(bStack_33e,CONCAT11(bStack_33f,local_340)));
        (*pIVar4->is->_vptr_IStream[3])(pIVar4->is,&local_340,4);
        bVar12 = bStack_33d;
        bVar11 = bStack_33e;
        bVar10 = bStack_33f;
        uVar15 = (uint)(byte)local_340;
        (*pIVar4->is->_vptr_IStream[3])(pIVar4->is,&local_340,4);
        iVar8 = CONCAT13(bStack_33d,CONCAT12(bStack_33e,CONCAT11(bStack_33f,local_340)));
        (*pIVar4->is->_vptr_IStream[3])(pIVar4->is,&local_340,4);
        iVar9 = CONCAT13(bStack_33d,CONCAT12(bStack_33e,CONCAT11(bStack_33f,local_340)));
        Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(pIVar4->is,(uint64_t *)&local_340);
        puVar17 = &pTVar3->dataSize;
        Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(pIVar4->is,puVar17);
        Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(pIVar4->is,&pTVar3->uncompressedDataSize);
        Xdr::skip<Imf_3_2::StreamIO,Imf_3_2::IStream>
                  (pIVar4->is,
                   CONCAT13(bStack_33d,CONCAT12(bStack_33e,CONCAT11(bStack_33f,local_340))));
        if (dx != iVar16) {
          pIVar20 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar20,"Unexpected tile x coordinate.");
LAB_0016a7ef:
          __cxa_throw(pIVar20,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
        }
        if (((uint)bVar12 << 0x18 | (uint)bVar11 << 0x10 | (uint)bVar10 * 0x100 + uVar15) != dy2) {
          pIVar20 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar20,"Unexpected tile y coordinate.");
          goto LAB_0016a7ef;
        }
        if (iVar8 != lx) {
          pIVar20 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar20,"Unexpected tile x level number coordinate.");
          goto LAB_0016a7ef;
        }
        if (iVar9 != ly) {
          pIVar20 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar20,"Unexpected tile y level number coordinate.");
          goto LAB_0016a7ef;
        }
        iVar16 = (*pIVar4->is->_vptr_IStream[2])();
        if ((char)iVar16 == '\0') {
          if (pTVar3->buffer != (char *)0x0) {
            operator_delete__(pTVar3->buffer);
          }
          uVar6 = *puVar17;
          pcVar19 = (char *)operator_new__(uVar6);
          pTVar3->buffer = pcVar19;
          (*pIVar4->is->_vptr_IStream[3])(pIVar4->is,pcVar19,uVar6 & 0xffffffff);
        }
        else {
          iVar16 = (*pIVar4->is->_vptr_IStream[4])(pIVar4->is,(ulong)(uint)*puVar17);
          pTVar3->buffer = (char *)CONCAT44(extraout_var_00,iVar16);
        }
        pIVar4->currentPosition =
             *puVar17 +
             uVar5 + CONCAT44(uStack_33c,
                              CONCAT13(bStack_33d,
                                       CONCAT12(bStack_33e,CONCAT11(bStack_33f,local_340)))) + 0x28;
        this_00 = (Task *)operator_new(0x20);
        IlmThread_3_2::Task::Task(this_00,local_1b8);
        *(undefined ***)this_00 = &PTR__TileBufferTask_003d74e8;
        *(Data **)(this_00 + 0x10) = pDVar1;
        *(TileBuffer **)(this_00 + 0x18) = pTVar3;
        IlmThread_3_2::ThreadPool::addGlobalTask(this_00);
        dx = dx + 1;
        uVar27 = uVar27 + 1;
      } while (iVar14 + 1 != dx);
      dy2 = dy2 + (uint)bVar28 * 2 + -1;
    } while (dy2 != uVar7);
  }
  IlmThread_3_2::TaskGroup::~TaskGroup(local_1b8);
  ppTVar2 = (this->_data->tileBuffers).
            super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar23 = (long)(this->_data->tileBuffers).
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2;
  if (lVar23 == 0) {
    psVar25 = (string *)0x0;
  }
  else {
    lVar23 = lVar23 >> 3;
    lVar24 = 0;
    psVar26 = (string *)0x0;
    do {
      pTVar3 = ppTVar2[lVar24];
      psVar25 = (string *)&pTVar3->exception;
      if (psVar26 != (string *)0x0) {
        psVar25 = psVar26;
      }
      if (pTVar3->hasException == false) {
        psVar25 = psVar26;
      }
      pTVar3->hasException = false;
      lVar24 = lVar24 + 1;
      psVar26 = psVar25;
    } while (lVar23 + (ulong)(lVar23 == 0) != lVar24);
  }
  if (psVar25 != (string *)0x0) {
    this_01 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::IoExc::IoExc(this_01,psVar25);
    __cxa_throw(this_01,&Iex_3_2::IoExc::typeinfo,Iex_3_2::IoExc::~IoExc);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepTiledInputFile::readTiles (
    int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    //
    // Read a range of tiles from the file into the framebuffer
    //

    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
        if (_data->slices.size () == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                                         "as pixel data destination.");

        if (!isValidLevel (lx, ly))
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Level coordinate "
                "(" << lx
                    << ", " << ly
                    << ") "
                       "is invalid.");

        //
        // Determine the first and last tile coordinates in both dimensions.
        // We always attempt to read the range of tiles in the order that
        // they are stored in the file.
        //

        if (dx1 > dx2) std::swap (dx1, dx2);

        if (dy1 > dy2) std::swap (dy1, dy2);

        int dyStart = dy1;
        int dyStop  = dy2 + 1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dyStop  = dy1 - 1;
            dY      = -1;
        }

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;
            int       tileNumber = 0;

            for (int dy = dyStart; dy != dyStop; dy += dY)
            {
                for (int dx = dx1; dx <= dx2; dx++)
                {
                    if (!isValidTile (dx, dy, lx, ly))
                        THROW (
                            IEX_NAMESPACE::ArgExc,
                            "Tile (" << dx << ", " << dy << ", " << lx << ","
                                     << ly << ") is not a valid tile.");

                    ThreadPool::addGlobalTask (newTileBufferTask (
                        &taskGroup, _data, tileNumber++, dx, dy, lx, ly));
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exception handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledInputFile::readTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string* exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size (); ++i)
        {
            TileBuffer* tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception) throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error reading pixel data from image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}